

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

void __thiscall
LLVMBC::SwitchInst::SwitchInst
          (SwitchInst *this,Value *cond_,BasicBlock *default_block_,uint num_cases)

{
  Type *pTVar1;
  LLVMContext *context;
  
  pTVar1 = Value::getType(cond_);
  context = Type::getContext(pTVar1);
  pTVar1 = Type::getVoidTy(context);
  Instruction::Instruction(&this->super_Instruction,pTVar1,Switch);
  this->cond = cond_;
  this->default_block = default_block_;
  (this->cases).
  super__Vector_base<LLVMBC::SwitchInst::Case,_dxil_spv::ThreadLocalAllocator<LLVMBC::SwitchInst::Case>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cases).
  super__Vector_base<LLVMBC::SwitchInst::Case,_dxil_spv::ThreadLocalAllocator<LLVMBC::SwitchInst::Case>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cases).
  super__Vector_base<LLVMBC::SwitchInst::Case,_dxil_spv::ThreadLocalAllocator<LLVMBC::SwitchInst::Case>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Instruction).is_terminator = true;
  std::vector<LLVMBC::SwitchInst::Case,_dxil_spv::ThreadLocalAllocator<LLVMBC::SwitchInst::Case>_>::
  reserve(&this->cases,(ulong)num_cases);
  return;
}

Assistant:

SwitchInst::SwitchInst(Value *cond_, BasicBlock *default_block_, unsigned num_cases)
    : Instruction(Type::getVoidTy(cond_->getType()->getContext()), ValueKind::Switch)
    , cond(cond_)
    , default_block(default_block_)
{
	set_terminator();
	cases.reserve(num_cases);
}